

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcpaddress.cpp
# Opt level: O3

bool __thiscall jrtplib::RTPTCPAddress::IsSameAddress(RTPTCPAddress *this,RTPAddress *addr)

{
  if ((addr != (RTPAddress *)0x0) && (addr->addresstype == TCPAddress)) {
    return *(int *)&addr->field_0xc == *(int *)&(this->super_RTPAddress).field_0xc;
  }
  return false;
}

Assistant:

bool RTPTCPAddress::IsSameAddress(const RTPAddress *addr) const
{
	if (addr == 0)
		return false;
	if (addr->GetAddressType() != TCPAddress)
		return false;

	const RTPTCPAddress *a = static_cast<const RTPTCPAddress *>(addr);

	// We're using a socket to identify connections
	if (a->m_socket == m_socket)
		return true;

	return false;
}